

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphereTriangleDetector.cpp
# Opt level: O2

void __thiscall
SphereTriangleDetector::getClosestPoints
          (SphereTriangleDetector *this,ClosestPointInput *input,Result *output,
          btIDebugDraw *debugDraw,bool swapResults)

{
  btTransform *this_00;
  bool bVar1;
  _func_int **pp_Var2;
  btScalar *in_R9;
  btVector3 bVar3;
  btScalar depth;
  btVector3 normal;
  btVector3 point;
  btVector3 pointOnA;
  btVector3 normalOnA;
  btTransform sphereInTr;
  btScalar local_cc;
  btVector3 local_c8;
  btVector3 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  btScalar local_88 [4];
  btScalar local_78 [4];
  btTransform local_68;
  
  this_00 = &input->m_transformB;
  local_cc = 0.0;
  btTransform::inverseTimes(&local_68,this_00,&input->m_transformA);
  bVar1 = collide(this,&local_68.m_origin,&local_b8,&local_c8,&local_cc,in_R9,
                  this->m_contactBreakingThreshold);
  if (bVar1) {
    if (swapResults) {
      bVar3 = operator*(&this_00->m_basis,&local_c8);
      local_98 = bVar3.m_floats._0_8_;
      local_a8 = bVar3.m_floats._8_8_;
      local_78._0_8_ = local_98 ^ 0x8000000080000000;
      local_78[2] = -bVar3.m_floats[2];
      local_78[3] = 0.0;
      bVar3 = btTransform::operator()(this_00,&local_b8);
      local_88[1] = local_cc * local_98._4_4_ + bVar3.m_floats[1];
      local_88[0] = local_cc * (float)local_98 + bVar3.m_floats[0];
      local_88[2] = (float)local_a8 * local_cc + bVar3.m_floats[2];
      local_88[3] = 0.0;
      pp_Var2 = output->_vptr_Result;
    }
    else {
      local_78 = (btScalar  [4])operator*(&this_00->m_basis,&local_c8);
      local_88 = (btScalar  [4])btTransform::operator()(this_00,&local_b8);
      pp_Var2 = output->_vptr_Result;
    }
    (*pp_Var2[4])(output,local_78);
  }
  return;
}

Assistant:

void	SphereTriangleDetector::getClosestPoints(const ClosestPointInput& input,Result& output,class btIDebugDraw* debugDraw,bool swapResults)
{

	(void)debugDraw;
	const btTransform& transformA = input.m_transformA;
	const btTransform& transformB = input.m_transformB;

	btVector3 point,normal;
	btScalar timeOfImpact = btScalar(1.);
	btScalar depth = btScalar(0.);
//	output.m_distance = btScalar(BT_LARGE_FLOAT);
	//move sphere into triangle space
	btTransform	sphereInTr = transformB.inverseTimes(transformA);

	if (collide(sphereInTr.getOrigin(),point,normal,depth,timeOfImpact,m_contactBreakingThreshold))
	{
		if (swapResults)
		{
			btVector3 normalOnB = transformB.getBasis()*normal;
			btVector3 normalOnA = -normalOnB;
			btVector3 pointOnA = transformB*point+normalOnB*depth;
			output.addContactPoint(normalOnA,pointOnA,depth);
		} else
		{
			output.addContactPoint(transformB.getBasis()*normal,transformB*point,depth);
		}
	}

}